

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof_recent.c
# Opt level: O0

void decrement_recent_count(tsd_t *tsd,prof_tctx_t *tctx)

{
  tsd_t *in_RSI;
  tsdn_t *in_RDI;
  prof_tctx_t *in_stack_ffffffffffffffd8;
  tsdn_t *tsdn;
  
  tsdn = in_RDI;
  malloc_mutex_assert_not_owner((tsdn_t *)in_stack_ffffffffffffffd8,(malloc_mutex_t *)0x255dcb9);
  malloc_mutex_lock(tsdn,(malloc_mutex_t *)in_RDI);
  in_RSI->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event =
       in_RSI->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event -
       1;
  duckdb_je_prof_tctx_try_destroy(in_RSI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void
decrement_recent_count(tsd_t *tsd, prof_tctx_t *tctx) {
	malloc_mutex_assert_not_owner(tsd_tsdn(tsd), &prof_recent_alloc_mtx);
	assert(tctx != NULL);
	malloc_mutex_lock(tsd_tsdn(tsd), tctx->tdata->lock);
	assert(tctx->recent_count > 0);
	--tctx->recent_count;
	prof_tctx_try_destroy(tsd, tctx);
}